

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  long lVar1;
  JObject *pJVar2;
  char local_9e [21];
  char local_89;
  JObject local_88;
  int local_74;
  int rc;
  pthread_t tid;
  pthread_t pStack_60;
  int i;
  value_type local_54;
  undefined1 local_50 [8];
  pthread_attr_t attrs;
  char **param_1_local;
  int param_0_local;
  
  param_1_local._4_4_ = 0;
  attrs._48_8_ = param_2;
  param_1_local._0_4_ = param_1;
  pthread_attr_init((pthread_attr_t *)local_50);
  pthread_attr_setscope((pthread_attr_t *)local_50,0);
  lVar1 = syscall(0xba);
  local_54 = (value_type)lVar1;
  std::vector<int,_std::allocator<int>_>::push_back(&lwps,&local_54);
  pStack_60 = pthread_self();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&threads,&stack0xffffffffffffffa0);
  tid._4_4_ = 0;
  while( true ) {
    if (9 < tid._4_4_) {
      while (pthread_mutex_lock((pthread_mutex_t *)&l), in_entry != 10) {
        pthread_cond_wait((pthread_cond_t *)&c,(pthread_mutex_t *)&l);
        pthread_mutex_unlock((pthread_mutex_t *)&l);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&l);
      pstack::JObject::JObject(&local_88,(ostream *)&std::cout);
      local_89 = '\0';
      pJVar2 = pstack::JObject::
               field<char[8],std::vector<unsigned_long,std::allocator<unsigned_long>>,char>
                         (&local_88,(char (*) [8])"threads",&threads,&local_89);
      local_9e[1] = 0;
      pJVar2 = pstack::JObject::field<char[5],std::vector<int,std::allocator<int>>,char>
                         (pJVar2,(char (*) [5])"lwps",&lwps,local_9e + 1);
      local_9e[0] = '\0';
      pstack::JObject::field<char[10],int,char>
                (pJVar2,(char (*) [10])"assert_at",&assertline,local_9e);
      pstack::JObject::~JObject(&local_88);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      raise(7);
      return param_1_local._4_4_;
    }
    local_74 = pthread_create((pthread_t *)&stack0xffffffffffffff90,(pthread_attr_t *)local_50,entry
                              ,(void *)((long)&tid + 4));
    if (local_74 != 0) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&threads,(value_type_conflict1 *)&stack0xffffffffffffff90);
    tid._4_4_ = tid._4_4_ + 1;
  }
  __assert_fail("rc == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/tests/thread.cc",
                0x30,"int main(int, char **)");
}

Assistant:

int
main(int /*unused*/, char ** /*unused*/)
{
   pthread_attr_t attrs;
   pthread_attr_init(&attrs);
   pthread_attr_setscope(&attrs, PTHREAD_SCOPE_SYSTEM);

   // the main thread will appear in the pstack output.
   lwps.push_back(syscall(SYS_gettid));
   threads.push_back(pthread_self());

   // Cretae 10 threads.
   for (int i = 0; i < 10; i++) {
      pthread_t tid;
      int rc = pthread_create(&tid, &attrs, entry, &i);
      assert(rc == 0);
      threads.push_back(tid);
   }

   // Make sure all threads have gotten to update in_entry.
   for (;;) {
      pthread_mutex_lock(&l);
      if (in_entry == 10) {
         pthread_mutex_unlock(&l);
         break;
      }
      pthread_cond_wait(&c, &l);
      pthread_mutex_unlock(&l);
   }
   {
      pstack::JObject(std::cout)
         .field("threads", threads)
         .field("lwps", lwps)
         .field("assert_at", assertline);
   }
   (std::cout << std::endl).flush();
   raise(SIGBUS);
}